

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O2

void __thiscall CLayers::InitGameLayer(CLayers *this)

{
  CMapItemGroup *pCVar1;
  CMapItemLayerTilemap *pCVar2;
  int g;
  int Index;
  int iVar3;
  
  Index = 0;
  do {
    if (this->m_GroupsNum <= Index) {
      return;
    }
    pCVar1 = GetGroup(this,Index);
    for (iVar3 = 0; iVar3 < (pCVar1->super_CMapItemGroup_v1).m_NumLayers; iVar3 = iVar3 + 1) {
      pCVar2 = (CMapItemLayerTilemap *)
               GetLayer(this,(pCVar1->super_CMapItemGroup_v1).m_StartLayer + iVar3);
      if (((pCVar2->m_Layer).m_Type == 2) && ((pCVar2->m_Flags & 1) != 0)) {
        this->m_pGameLayer = pCVar2;
        this->m_pGameGroup = pCVar1;
        (pCVar1->super_CMapItemGroup_v1).m_OffsetX = 0;
        (pCVar1->super_CMapItemGroup_v1).m_OffsetY = 0;
        (pCVar1->super_CMapItemGroup_v1).m_ParallaxX = 100;
        (pCVar1->super_CMapItemGroup_v1).m_ParallaxY = 100;
        if ((pCVar1->super_CMapItemGroup_v1).m_Version < 2) {
          return;
        }
        pCVar1->m_UseClipping = 0;
        pCVar1->m_ClipX = 0;
        pCVar1->m_ClipY = 0;
        pCVar1->m_ClipW = 0;
        pCVar1->m_ClipH = 0;
        return;
      }
    }
    Index = Index + 1;
  } while( true );
}

Assistant:

void CLayers::InitGameLayer()
{
	for(int g = 0; g < NumGroups(); g++)
	{
		CMapItemGroup *pGroup = GetGroup(g);
		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = GetLayer(pGroup->m_StartLayer+l);
			if(pLayer->m_Type == LAYERTYPE_TILES)
			{
				CMapItemLayerTilemap *pTilemap = reinterpret_cast<CMapItemLayerTilemap *>(pLayer);
				if(pTilemap->m_Flags&TILESLAYERFLAG_GAME)
				{
					m_pGameLayer = pTilemap;
					m_pGameGroup = pGroup;

					// make sure the game group has standard settings
					m_pGameGroup->m_OffsetX = 0;
					m_pGameGroup->m_OffsetY = 0;
					m_pGameGroup->m_ParallaxX = 100;
					m_pGameGroup->m_ParallaxY = 100;

					if(m_pGameGroup->m_Version >= 2)
					{
						m_pGameGroup->m_UseClipping = 0;
						m_pGameGroup->m_ClipX = 0;
						m_pGameGroup->m_ClipY = 0;
						m_pGameGroup->m_ClipW = 0;
						m_pGameGroup->m_ClipH = 0;
					}

					return; // there can only be one game layer and game group
				}
			}
		}
	}
}